

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O2

int fse(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  void *returnvalue;
  undefined8 *returnvalue_00;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  lVar14 = *user_data;
  dVar6 = *(double *)((long)user_data + 0x40);
  dVar7 = *(double *)((long)user_data + 0x48);
  dVar4 = *(double *)((long)user_data + 0x50);
  dVar5 = *(double *)((long)user_data + 8);
  returnvalue = (void *)N_VGetArrayPointer();
  iVar10 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  iVar13 = 1;
  if (iVar10 == 0) {
    returnvalue_00 = (undefined8 *)N_VGetArrayPointer(ydot);
    iVar10 = check_retval(returnvalue_00,"N_VGetArrayPointer",0);
    if (iVar10 == 0) {
      N_VConst(0,ydot);
      auVar15._0_8_ = dVar6 * -0.5;
      auVar15._8_8_ = dVar7 * -0.5;
      auVar16._8_4_ = SUB84(dVar5,0);
      auVar16._0_8_ = dVar5;
      auVar16._12_4_ = (int)((ulong)dVar5 >> 0x20);
      auVar16 = divpd(auVar15,auVar16);
      lVar14 = lVar14 + -1;
      lVar12 = 0x28;
      for (lVar11 = 1; lVar11 < lVar14; lVar11 = lVar11 + 1) {
        dVar6 = *(double *)((long)returnvalue + lVar12 + 0x18);
        pdVar1 = (double *)((long)returnvalue + lVar12 + -0x28);
        dVar8 = pdVar1[1];
        pdVar2 = (double *)((long)returnvalue + lVar12 + 8);
        dVar9 = pdVar2[1];
        dVar7 = *(double *)((long)returnvalue + lVar12 + -0x18);
        pdVar3 = (double *)((long)returnvalue_00 + lVar12 + -0x10);
        *pdVar3 = (*pdVar2 - *pdVar1) * auVar16._0_8_;
        pdVar3[1] = (dVar9 - dVar8) * auVar16._8_8_;
        *(double *)((long)returnvalue_00 + lVar12) = (dVar6 - dVar7) * ((dVar4 * -0.5) / dVar5);
        lVar12 = lVar12 + 0x18;
      }
      *returnvalue_00 = 0;
      returnvalue_00[1] = 0;
      returnvalue_00[2] = 0;
      returnvalue_00[lVar14 * 3] = 0;
      (returnvalue_00 + lVar14 * 3)[1] = 0;
      returnvalue_00[lVar14 * 3 + 2] = 0;
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

static int fse(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype au     = udata->au;
  sunrealtype av     = udata->av;
  sunrealtype aw     = udata->aw;
  sunrealtype dx     = udata->dx;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype auconst, avconst, awconst, ul, ur, vl, vr, wl, wr;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  auconst = -au / SUN_RCONST(2.0) / dx;
  avconst = -av / SUN_RCONST(2.0) / dx;
  awconst = -aw / SUN_RCONST(2.0) / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    ul = Ydata[IDX(i - 1, 0)];
    ur = Ydata[IDX(i + 1, 0)];
    vl = Ydata[IDX(i - 1, 1)];
    vr = Ydata[IDX(i + 1, 1)];
    wl = Ydata[IDX(i - 1, 2)];
    wr = Ydata[IDX(i + 1, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = (ur - ul) * auconst;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = (vr - vl) * avconst;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (wr - wl) * awconst;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}